

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9ATree(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  uint fAddCones;
  uint fAddExtra;
  char *pcVar4;
  uint local_3c;
  
  fAddExtra = 0;
  Extra_UtilGetoptReset();
  fAddCones = 0;
  local_3c = 0;
  bVar1 = false;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"ecvwh"), iVar2 == 0x77) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar2 == -1) break;
    if (iVar2 == 99) {
      fAddCones = fAddCones ^ 1;
    }
    else if (iVar2 == 0x76) {
      local_3c = local_3c ^ 1;
    }
    else {
      if (iVar2 != 0x65) {
        Abc_Print(-2,"usage: &atree [-ecvwh]\n");
        Abc_Print(-2,"\t         extracts adder tree rooting in primary outputs\n");
        pcVar4 = "yes";
        pcVar3 = "yes";
        if (fAddExtra == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-e     : toggles adding extra outputs [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (fAddCones == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-c     : toggles duplicating complete AIG [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (local_3c == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar3);
        if (!bVar1) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-w     : toggles printing very verbose information [default = %s]\n",pcVar4)
        ;
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      fAddExtra = fAddExtra ^ 1;
    }
  }
  if (pAbc->pGia != (Gia_Man_t *)0x0) {
    pNew = Gia_PolynCoreDetectTest(pAbc->pGia,fAddExtra,fAddCones,local_3c);
    Abc_FrameUpdateGia(pAbc,pNew);
    return 0;
  }
  Abc_Print(-1,"Abc_CommandAbc9Esop(): There is no AIG.\n");
  return 0;
}

Assistant:

int Abc_CommandAbc9ATree( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_PolynCoreDetectTest( Gia_Man_t * pGia, int fAddExtra, int fAddCones, int fVerbose );
    Gia_Man_t * pTemp = NULL;
    int c, fAddExtra = 0, fAddCones = 0, fVerbose = 0, fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ecvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'e':
            fAddExtra ^= 1;
            break;
        case 'c':
            fAddCones ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Esop(): There is no AIG.\n" );
        return 0;
    }
    pTemp = Gia_PolynCoreDetectTest( pAbc->pGia, fAddExtra, fAddCones, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &atree [-ecvwh]\n" );
    Abc_Print( -2, "\t         extracts adder tree rooting in primary outputs\n" );
    Abc_Print( -2, "\t-e     : toggles adding extra outputs [default = %s]\n",  fAddExtra? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggles duplicating complete AIG [default = %s]\n",  fAddCones? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggles printing very verbose information [default = %s]\n",  fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}